

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_boolean_with_map(void)

{
  size_type sVar1;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_348;
  basic_variable<std::allocator<char>_> *local_2c8;
  basic_variable<std::allocator<char>_> *local_2b0;
  error *ex_1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_268;
  undefined1 local_208 [77];
  undefined1 local_1bb;
  undefined1 local_1ba [2];
  undefined1 local_1b8 [8];
  variable data_1;
  error *ex;
  basic_variable<std::allocator<char>_> local_148;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 auStack_e8 [32];
  basic_variable<std::allocator<char>_> local_c8;
  undefined1 local_98 [93];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_38,false);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1e9,"void append_suite::append_boolean_with_map()",local_3a,&local_3b);
  auStack_e8._24_8_ = &local_c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_148,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_118,"hydrogen");
  auStack_e8._8_8_ = &local_148;
  auStack_e8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_c8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_e8 + 8));
  local_98._0_8_ = &local_c8;
  local_98._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  local_2b0 = (basic_variable<std::allocator<char>_> *)local_98;
  do {
    local_2b0 = local_2b0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_2b0);
  } while (local_2b0 != &local_c8);
  local_2c8 = (basic_variable<std::allocator<char>_> *)auStack_e8;
  do {
    local_2c8 = local_2c8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_2c8);
  } while (local_2c8 != &local_148);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=({{ \"alpha\", \"hydrogen\" }})","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1ec,"void append_suite::append_boolean_with_map()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_1b8,false);
  local_1ba[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_1b8);
  local_1bb = '\x01';
  sVar1 = 0x1f0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1f0,"void append_suite::append_boolean_with_map()",local_1ba,&local_1bb);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[9],_true>
            (&local_268,(char (*) [6])"alpha",(char (*) [9])"hydrogen");
  local_208._0_8_ = &local_268;
  local_208._8_8_ = 1;
  init._M_len = sVar1;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_208 + 0x10),
             (basic_map<std::allocator<char>_> *)local_208._0_8_,init);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_1b8,
             (basic_variable<std::allocator<char>_> *)(local_208 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_208 + 0x10));
  local_348 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_208;
  do {
    local_348 = local_348 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_348);
  } while (local_348 != &local_268);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(map::make({{ \"alpha\", \"hydrogen\" }}))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,499,"void append_suite::append_boolean_with_map()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1b8);
  return;
}

Assistant:

void append_boolean_with_map()
{
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=({{ "alpha", "hydrogen" }}),
                                        error,
                                        "incompatible type");
    }
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(map::make({{ "alpha", "hydrogen" }})),
                                        error,
                                        "incompatible type");
    }
}